

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_bson_cursor<std::__cxx11::istringstream&>(void *param_1)

{
  uint uVar1;
  undefined8 in_R8;
  bson_decode_options *unaff_retaddr;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000010;
  allocator<char> *in_stack_fffffffffffffff8;
  
  ser_context::ser_context((ser_context *)((long)param_1 + 0x2a0));
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)param_1);
  (((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)(vtable + 0x18);
  (((basic_staj_visitor<char> *)((long)param_1 + 0x2a0))->super_basic_json_visitor<char>).
  _vptr_basic_json_visitor = (_func_int **)(vtable + 0xb8);
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_parser<std::__cxx11::istringstream&>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
  basic_staj_visitor<char>::basic_staj_visitor((basic_staj_visitor<char> *)param_1);
  *(undefined1 *)&((basic_staj_visitor<char> *)((long)param_1 + 0x240))->index_ = 0;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::cursor_mode
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             &((basic_staj_visitor<char> *)param_1)->event_,true);
  uVar1 = (*(((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>).
            _vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>).
      _vptr_basic_json_visitor[8])(param_1,in_R8);
  }
  return;
}

Assistant:

basic_bson_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source,
        const bson_decode_options& options,
        std::error_code& ec)
       : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }